

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O2

void SudokuGitter::printIntVec
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,string *name)

{
  uint uVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)name);
  std::operator<<(poVar2,": ");
  for (uVar1 = 0;
      (ulong)uVar1 <
      (ulong)((long)(vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2); uVar1 = uVar1 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout," ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void SudokuGitter::printIntVec(vector<unsigned int> vec, string name) {
    // Print Original Vector
    std::cout << name << ": ";
    for (unsigned int i = 0; i < vec.size(); i++)
        std::cout << " " << vec[i];

    std::cout << std::endl;
}